

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float fVar1;
  ushort uVar2;
  int iVar3;
  ImFontGlyph *pIVar4;
  float *pfVar5;
  unsigned_short *puVar6;
  ImFontGlyph *__src;
  float local_50;
  int local_2c;
  int i_2;
  ImFontGlyph *tab_glyph;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  ImFont *this_local;
  
  i_1 = 0;
  for (codepoint = 0; codepoint != (this->Glyphs).Size; codepoint = codepoint + 1) {
    pIVar4 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,codepoint);
    i_1 = ImMax<int>(i_1,(uint)pIVar4->Codepoint);
  }
  if ((this->Glyphs).Size < 0xffff) {
    ImVector<float>::clear(&this->IndexAdvanceX);
    ImVector<unsigned_short>::clear(&this->IndexLookup);
    this->DirtyLookupTables = false;
    GrowIndex(this,i_1 + 1);
    for (tab_glyph._4_4_ = 0; tab_glyph._4_4_ < (this->Glyphs).Size;
        tab_glyph._4_4_ = tab_glyph._4_4_ + 1) {
      pIVar4 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,tab_glyph._4_4_);
      uVar2 = pIVar4->Codepoint;
      pIVar4 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,tab_glyph._4_4_);
      fVar1 = pIVar4->AdvanceX;
      pfVar5 = ImVector<float>::operator[](&this->IndexAdvanceX,(uint)uVar2);
      *pfVar5 = fVar1;
      puVar6 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)uVar2);
      *puVar6 = (unsigned_short)tab_glyph._4_4_;
    }
    pIVar4 = FindGlyph(this,0x20);
    if (pIVar4 != (ImFontGlyph *)0x0) {
      pIVar4 = ImVector<ImFontGlyph>::back(&this->Glyphs);
      if (pIVar4->Codepoint != 9) {
        ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
      }
      pIVar4 = ImVector<ImFontGlyph>::back(&this->Glyphs);
      __src = FindGlyph(this,0x20);
      memcpy(pIVar4,__src,0x28);
      pIVar4->Codepoint = 9;
      pIVar4->AdvanceX = pIVar4->AdvanceX * 4.0;
      fVar1 = pIVar4->AdvanceX;
      pfVar5 = ImVector<float>::operator[](&this->IndexAdvanceX,(uint)pIVar4->Codepoint);
      *pfVar5 = fVar1;
      iVar3 = (this->Glyphs).Size;
      puVar6 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)pIVar4->Codepoint);
      *puVar6 = (short)iVar3 - 1;
    }
    pIVar4 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar4;
    if (this->FallbackGlyph == (ImFontGlyph *)0x0) {
      local_50 = 0.0;
    }
    else {
      local_50 = this->FallbackGlyph->AdvanceX;
    }
    this->FallbackAdvanceX = local_50;
    for (local_2c = 0; local_2c < i_1 + 1; local_2c = local_2c + 1) {
      pfVar5 = ImVector<float>::operator[](&this->IndexAdvanceX,local_2c);
      if (*pfVar5 <= 0.0 && *pfVar5 != 0.0) {
        fVar1 = this->FallbackAdvanceX;
        pfVar5 = ImVector<float>::operator[](&this->IndexAdvanceX,local_2c);
        *pfVar5 = fVar1;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x9c8,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}